

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quic_unacked_packet_map.cc
# Opt level: O2

void __thiscall
quic::QuicUnackedPacketMap::PickLostPackets
          (QuicUnackedPacketMap *this,list<unsigned_short,_std::allocator<unsigned_short>_> *packets
          ,uint16_t latest_number)

{
  ushort uVar1;
  int sequence_number;
  bool bVar2;
  unsigned_short prev_value;
  undefined8 in_RAX;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  bVar2 = IsNewer<unsigned_short>(this->_least_unack_packet_number,latest_number);
  if (!bVar2) {
    prev_value = this->_least_unack_packet_number;
    while( true ) {
      bVar2 = IsNewer<unsigned_short>(latest_number,prev_value);
      if (!bVar2) break;
      uVar1 = this->_least_unack_packet_number;
      sequence_number = this->_unack_sequence_numbers[uVar1];
      if (sequence_number != -1) {
        uStack_38 = CONCAT26((short)sequence_number,(undefined6)uStack_38);
        std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (packets,(value_type_conflict *)((long)&uStack_38 + 6));
        ReduceInflightPacket(this,sequence_number);
        uVar1 = this->_least_unack_packet_number;
        this->_unack_sequence_numbers[uVar1] = -1;
      }
      prev_value = uVar1 + 1;
      this->_least_unack_packet_number = prev_value;
    }
    this->_least_unack_packet_number = latest_number;
  }
  return;
}

Assistant:

void QuicUnackedPacketMap::PickLostPackets(std::list<uint16_t> &packets, uint16_t latest_number)
	{
		if (IsNewer(_least_unack_packet_number, latest_number))
			return;
		int32_t sequence_number = -1;
		while (IsNewer(latest_number, _least_unack_packet_number)) {
			sequence_number = _unack_sequence_numbers[_least_unack_packet_number];
			if (sequence_number != -1) {
				packets.push_back(sequence_number);
#ifdef OUTPUT_VERBOSE_INFO
				dd::OutputDebugInfo("PickLostPackets packet lost, packet number = %d, sequence number = %d\r\n",
					_least_unack_packet_number, sequence_number);
#endif

				ReduceInflightPacket(sequence_number);
				_unack_sequence_numbers[_least_unack_packet_number] = -1;
			}

			_least_unack_packet_number++;

#ifdef OUTPUT_VERBOSE_INFO
			dd::OutputDebugInfo("PickLostPackets _unack_sequence_numbers[%d] = -1\r\n", _least_unack_packet_number);
#endif
		}
		_least_unack_packet_number = latest_number;

#ifdef OUTPUT_VERBOSE_INFO
		dd::OutputDebugInfo("PickLostPackets set _least_unack_packet_number = %d\r\n", _least_unack_packet_number);
#endif
	}